

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * multadd(Bigint *b,int m,int a)

{
  int iVar1;
  ulong uVar2;
  Bigint *b1;
  unsigned_long_long y;
  unsigned_long_long carry;
  ULong *x;
  int wds;
  int i;
  int a_local;
  int m_local;
  Bigint *b_local;
  
  iVar1 = b->wds;
  x._4_4_ = 0;
  y = (unsigned_long_long)a;
  carry = (unsigned_long_long)b->x;
  do {
    uVar2 = (ulong)*(uint *)carry * (long)m + y;
    y = uVar2 >> 0x20;
    *(int *)carry = (int)uVar2;
    x._4_4_ = x._4_4_ + 1;
    carry = carry + 4;
  } while (x._4_4_ < iVar1);
  _a_local = b;
  if (y != 0) {
    if (b->maxwds <= iVar1) {
      _a_local = Balloc(b->k + 1);
      memcpy(&_a_local->sign,&b->sign,(long)b->wds * 4 + 8);
      Bfree(b);
    }
    _a_local->x[iVar1] = (ULong)(uVar2 >> 0x20);
    _a_local->wds = iVar1 + 1;
  }
  return _a_local;
}

Assistant:

static Bigint *
multadd(Bigint *b, int m, int a MTd)	/* multiply by m and add a */
{
	int i, wds;
#ifdef ULLong
	ULong *x;
	ULLong carry, y;
#else
	ULong carry, *x, y;
#ifdef Pack_32
	ULong xi, z;
#endif
#endif
	Bigint *b1;

	wds = b->wds;
	x = b->x;
	i = 0;
	carry = a;
	do {
#ifdef ULLong
		y = *x * (ULLong)m + carry;
		carry = y >> 32;
		*x++ = y & FFFFFFFF;
#else
#ifdef Pack_32
		xi = *x;
		y = (xi & 0xffff) * m + carry;
		z = (xi >> 16) * m + (y >> 16);
		carry = z >> 16;
		*x++ = (z << 16) + (y & 0xffff);
#else
		y = *x * m + carry;
		carry = y >> 16;
		*x++ = y & 0xffff;
#endif
#endif
		}
		while(++i < wds);
	if (carry) {
		if (wds >= b->maxwds) {
			b1 = Balloc(b->k+1 MTa);
			Bcopy(b1, b);
			Bfree(b MTa);
			b = b1;
			}
		b->x[wds++] = carry;
		b->wds = wds;
		}
	return b;
	}